

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O1

void __thiscall leveldb::anon_unknown_0::MergingIterator::FindSmallest(MergingIterator *this)

{
  IteratorWrapper *pIVar1;
  undefined8 *puVar2;
  IteratorWrapper *pIVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  IteratorWrapper *pIVar7;
  IteratorWrapper *pIVar8;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined8 local_40;
  undefined8 uStack_38;
  
  if (this->n_ < 1) {
    pIVar8 = (IteratorWrapper *)0x0;
  }
  else {
    lVar6 = 0;
    lVar5 = 0;
    pIVar7 = (IteratorWrapper *)0x0;
    do {
      pIVar3 = this->children_;
      pIVar8 = pIVar7;
      if (((&pIVar3->valid_)[lVar6] == true) &&
         (pIVar1 = (IteratorWrapper *)((long)&pIVar3->iter_ + lVar6), pIVar8 = pIVar1,
         pIVar7 != (IteratorWrapper *)0x0)) {
        if ((&pIVar3->valid_)[lVar6] == false) {
LAB_0011d34a:
          __assert_fail("Valid()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/./table/iterator_wrapper.h"
                        ,0x27,"Slice leveldb::IteratorWrapper::key() const");
        }
        puVar2 = (undefined8 *)((long)&(pIVar3->key_).data_ + lVar6);
        local_40 = *puVar2;
        uStack_38 = puVar2[1];
        if (pIVar7->valid_ == false) goto LAB_0011d34a;
        local_50 = *(undefined4 *)&(pIVar7->key_).data_;
        uStack_4c = *(undefined4 *)((long)&(pIVar7->key_).data_ + 4);
        uStack_48 = (undefined4)(pIVar7->key_).size_;
        uStack_44 = *(undefined4 *)((long)&(pIVar7->key_).size_ + 4);
        iVar4 = (*this->comparator_->_vptr_Comparator[2])(this->comparator_,&local_40,&local_50);
        pIVar8 = pIVar7;
        if (iVar4 < 0) {
          pIVar8 = pIVar1;
        }
      }
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x20;
      pIVar7 = pIVar8;
    } while (lVar5 < this->n_);
  }
  this->current_ = pIVar8;
  return;
}

Assistant:

void MergingIterator::FindSmallest() {
  IteratorWrapper* smallest = nullptr;
  for (int i = 0; i < n_; i++) {
    IteratorWrapper* child = &children_[i];
    if (child->Valid()) {
      if (smallest == nullptr) {
        smallest = child;
      } else if (comparator_->Compare(child->key(), smallest->key()) < 0) {
        smallest = child;
      }
    }
  }
  current_ = smallest;
}